

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstDebugPrintfPass::NewGlobalName
          (InstDebugPrintfPass *this,uint32_t id,string *name_str)

{
  undefined8 in_RCX;
  allocator<char> local_49;
  string local_48 [8];
  string prefixed_name;
  string *name_str_local;
  uint32_t id_local;
  InstDebugPrintfPass *this_local;
  
  prefixed_name.field_2._8_8_ = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"inst_printf_",&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::operator+=(local_48,(string *)prefixed_name.field_2._8_8_);
  InstrumentPass::NewName(&this->super_InstrumentPass,id,(string *)((ulong)name_str & 0xffffffff));
  std::__cxx11::string::~string(local_48);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstDebugPrintfPass::NewGlobalName(
    uint32_t id, const std::string& name_str) {
  std::string prefixed_name{"inst_printf_"};
  prefixed_name += name_str;
  return NewName(id, prefixed_name);
}